

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O0

void __thiscall cppcms::http::file::output_file(file *this,string *name,bool is_temporary)

{
  int iVar1;
  string *error;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  file_buffer *unaff_retaddr;
  file_buffer *in_stack_ffffffffffffffc8;
  string *n;
  
  n = in_RDI;
  booster::hold_ptr<cppcms::http::file::impl_data>::operator->
            ((hold_ptr<cppcms::http::file::impl_data> *)&in_RDI[0x22]._M_string_length);
  impl::file_buffer::name(unaff_retaddr,n);
  if ((in_DL & 1) == 0) {
    booster::hold_ptr<cppcms::http::file::impl_data>::operator->
              ((hold_ptr<cppcms::http::file::impl_data> *)&in_RDI[0x22]._M_string_length);
    iVar1 = impl::file_buffer::to_file(in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      error = (string *)__cxa_allocate_exception(0x30);
      std::operator+((char *)n,in_RSI);
      cppcms_error::cppcms_error((cppcms_error *)in_RDI,error);
      __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
  }
  *(uint *)(in_RDI + 0x22) = *(uint *)(in_RDI + 0x22) & 0xfffffffd | 2;
  *(uint *)(in_RDI + 0x22) = *(uint *)(in_RDI + 0x22) & 0xfffffffb | (uint)((in_DL & 1) != 0) << 2;
  return;
}

Assistant:

void file::output_file(std::string const &name,bool is_temporary)
{
	d->fb.name(name);
	if(!is_temporary) {
		if(d->fb.to_file()!=0) {
			throw cppcms_error("Failed to write to file " + name);
		}
	}
	file_specified_ = 1;
	file_temporary_ = is_temporary ? 1:0;

}